

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf_reader.c
# Opt level: O1

int read_int(char **token)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  
  skip_spaces(token);
  cVar1 = **token;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    *token = *token + 1;
  }
  ppuVar3 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar3 + (long)**token * 2 + 1) & 8) != 0) {
    pcVar4 = *token;
    lVar6 = (long)*pcVar4;
    iVar5 = 0;
    if ((*(byte *)((long)*ppuVar3 + lVar6 * 2 + 1) & 8) != 0) {
      iVar5 = 0;
      do {
        pcVar4 = pcVar4 + 1;
        iVar5 = (int)(char)lVar6 + iVar5 * 10 + -0x30;
        *token = pcVar4;
        lVar6 = (long)*pcVar4;
      } while ((*(byte *)((long)*ppuVar3 + lVar6 * 2 + 1) & 8) != 0);
    }
    iVar2 = -iVar5;
    if (cVar1 != '-') {
      iVar2 = iVar5;
    }
    return iVar2;
  }
  printf("Parsing error. Unexpected char: %c.\n");
  exit(1);
}

Assistant:

static int read_int(char **token)
{
    int value = 0;
    int neg = 0;

    skip_spaces(token);
    if (**token == '-') {
        neg = 1;
        (*token)++;
    } else if (**token == '+')
        (*token)++;

    if (!isdigit(**token)) {
        printf("Parsing error. Unexpected char: %c.\n", **token);
        exit(EXIT_FAILURE);
    }
    while (isdigit(**token)) {
        value = (value * 10) + (**token - '0');
        (*token)++;
    }
    return neg ? -value : value;
}